

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::anon_unknown_12::ScanLineProcess::copy_sample_count
          (ScanLineProcess *this,DeepFrameBuffer *outfb,int fbY)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  Slice *pSVar5;
  void *__src;
  int in_EDX;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  int x;
  uint8_t *ptr;
  int32_t *counts;
  int y;
  int64_t yS;
  int64_t xS;
  int end;
  Slice *scslice;
  int local_54;
  char *local_50;
  int local_3c;
  
  pSVar5 = DeepFrameBuffer::getSampleCountSlice(in_RSI);
  iVar1 = *(int *)(in_RDI + 0x14);
  iVar2 = *(int *)(in_RDI + 0xac);
  sVar3 = pSVar5->xStride;
  sVar4 = pSVar5->yStride;
  for (local_3c = *(int *)(in_RDI + 0xa8); local_3c < iVar1 - iVar2; local_3c = local_3c + 1) {
    __src = (void *)(*(long *)(in_RDI + 0xf0) + (long)(local_3c * *(int *)(in_RDI + 0x18)) * 4);
    local_50 = pSVar5->base +
               ((long)in_EDX + (long)local_3c) * sVar4 + (long)*(int *)(in_RDI + 0xc) * sVar3;
    if (sVar3 == 4) {
      memcpy(local_50,__src,(long)*(int *)(in_RDI + 0x18) << 2);
    }
    else {
      for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x18); local_54 = local_54 + 1) {
        *(undefined4 *)local_50 = *(undefined4 *)((long)__src + (long)local_54 * 4);
        local_50 = local_50 + sVar3;
      }
    }
  }
  return;
}

Assistant:

void ScanLineProcess::copy_sample_count (
    const DeepFrameBuffer *outfb,
    int fbY)
{
    const Slice& scslice = outfb->getSampleCountSlice ();

    int     end = cinfo.height - decoder.user_line_end_ignore;
    int64_t xS = int64_t (scslice.xStride);
    int64_t yS = int64_t (scslice.yStride);

    for ( int y = decoder.user_line_begin_skip; y < end; ++y )
    {
        const int32_t* counts = decoder.sample_count_table + y * cinfo.width;
        uint8_t*       ptr;

        ptr = reinterpret_cast<uint8_t*> (scslice.base);
        ptr += int64_t (cinfo.start_x) * xS;
        ptr += (int64_t (fbY) + int64_t (y)) * yS;

        if (xS == sizeof(int32_t))
        {
            memcpy (ptr, counts, cinfo.width * sizeof(int32_t));
        }
        else
        {
            for ( int x = 0; x < cinfo.width; ++x )
            {
                *((int32_t *)ptr) = counts[x];
                ptr += xS;
            }
        }
    }
}